

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O2

void nn_sinproc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  undefined8 uVar5;
  ulong uVar6;
  
  if (self->state == 3) {
    uVar6 = (ulong)(uint)src;
    if (src == 0x6c41) {
      if (type != 5) {
        uVar1 = *(uint *)&self[1].fn;
        if (uVar1 != 6) goto LAB_0012110b;
        if (type != 6) {
          pcVar4 = "Unexpected action";
          uVar3 = 6;
          uVar6 = 0x6c41;
          uVar5 = 0x103;
          goto LAB_00121162;
        }
LAB_00120fcc:
        *(undefined4 *)&self[1].fn = 7;
      }
    }
    else {
      if (src != -2) {
LAB_001210d8:
        uVar1 = *(uint *)&self[1].fn;
        if (uVar1 == 6) {
          pcVar4 = "Unexpected source";
          uVar3 = 6;
          uVar5 = 0x106;
        }
        else {
LAB_0012110b:
          uVar3 = (ulong)uVar1;
          pcVar4 = "Unexpected state";
          uVar5 = 0x109;
        }
LAB_00121162:
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar4,uVar3,uVar6,
                (ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/sinproc.c"
                ,uVar5);
        goto LAB_00121053;
      }
      if (type != 5) {
        if (type != -3) goto LAB_001210d8;
        if ((*(uint *)&self[1].fn | 4) == 5) goto LAB_00120fcc;
        nn_pipebase_stop((nn_pipebase *)&self[1].state);
        if (self->state - 4U < 0xfffffffe) {
          pcVar4 = "self->fsm.state == 2 || self->fsm.state == 3";
          uVar5 = 0xe5;
          goto LAB_0012104c;
        }
        nn_fsm_raiseto(self,(nn_fsm *)self[1].shutdown_fn,
                       (nn_fsm_event *)&((nn_fsm *)self[1].shutdown_fn)[6].stopped.type,0x6c41,6,
                       self);
        *(undefined4 *)&self[1].fn = 6;
      }
    }
    if (*(int *)&self[1].fn != 7) {
      return;
    }
    iVar2 = nn_fsm_event_active((nn_fsm_event *)&self[6].owner);
    if (iVar2 != 0) {
      return;
    }
    iVar2 = nn_fsm_event_active((nn_fsm_event *)&self[6].stopped.type);
    if (iVar2 != 0) {
      return;
    }
    iVar2 = nn_fsm_event_active((nn_fsm_event *)&self[5].ctx);
    if (iVar2 == 0) {
      iVar2 = nn_fsm_event_active((nn_fsm_event *)&self[5].stopped.item);
      if (iVar2 == 0) {
        nn_fsm_stopped(self,7);
        return;
      }
      pcVar4 = "!nn_fsm_event_active (&sinproc->event_sent)";
      uVar5 = 0x12a;
    }
    else {
      pcVar4 = "!nn_fsm_event_active (&sinproc->event_connect)";
      uVar5 = 0x129;
    }
  }
  else {
    pcVar4 = "sinproc->fsm.state == 3";
    uVar5 = 0x115;
  }
LAB_0012104c:
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar4,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/inproc/sinproc.c"
          ,uVar5);
LAB_00121053:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_sinproc_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_sinproc *sinproc;

    sinproc = nn_cont (self, struct nn_sinproc, fsm);
    nn_assert (sinproc->fsm.state == 3);

    nn_sinproc_shutdown_events (sinproc, src, type, srcptr);

    /*  ***************  */
    /*  States to check  */
    /*  ***************  */

    /*  Have we got notification that peer is stopped  */
    if (nn_slow (sinproc->state != NN_SINPROC_STATE_STOPPING)) {
        return;
    }

    /*  Are all events processed? We can't cancel them unfortunately  */
    if (nn_fsm_event_active (&sinproc->event_received)
        || nn_fsm_event_active (&sinproc->event_disconnect))
    {
        return;
    }
    /*  These events are deemed to be impossible here  */
    nn_assert (!nn_fsm_event_active (&sinproc->event_connect));
    nn_assert (!nn_fsm_event_active (&sinproc->event_sent));

    /*  **********************************************  */
    /*  All checks are successful. Just stop right now  */
    /*  **********************************************  */

    nn_fsm_stopped (&sinproc->fsm, NN_SINPROC_STOPPED);
    return;
}